

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

bool __thiscall
cbtQuantizedBvh::serialize
          (cbtQuantizedBvh *this,void *o_alignedDataBuffer,uint param_2,bool i_swapEndian)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  uint uVar9;
  cbtQuantizedBvhNode *pcVar10;
  cbtBvhSubtreeInfo *pcVar11;
  undefined8 uVar12;
  int i;
  int iVar13;
  long lVar14;
  undefined7 in_register_00000009;
  cbtOptimizedBvhNode *pcVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long *plVar19;
  void *pvVar20;
  long lVar21;
  char *pcVar22;
  undefined4 *puVar23;
  ulong uVar24;
  undefined4 *puVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  cbtQuantizedBvh((cbtQuantizedBvh *)o_alignedDataBuffer);
  if ((int)CONCAT71(in_register_00000009,i_swapEndian) == 0) {
    *(int *)((long)o_alignedDataBuffer + 0x3c) = this->m_curNodeIndex;
    uVar12 = *(undefined8 *)((this->m_bvhAabbMin).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 8) = *(undefined8 *)(this->m_bvhAabbMin).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x10) = uVar12;
    uVar12 = *(undefined8 *)((this->m_bvhAabbMax).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x18) = *(undefined8 *)(this->m_bvhAabbMax).m_floats
    ;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x20) = uVar12;
    uVar12 = *(undefined8 *)((this->m_bvhQuantization).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x28) =
         *(undefined8 *)(this->m_bvhQuantization).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x30) = uVar12;
    *(cbtTraversalMode *)((long)o_alignedDataBuffer + 200) = this->m_traversalMode;
    iVar13 = this->m_subtreeHeaderCount;
  }
  else {
    uVar5 = swap_bytes(this->m_curNodeIndex);
    *(undefined4 *)((long)o_alignedDataBuffer + 0x3c) = uVar5;
    lVar14 = 0;
    do {
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 8) =
           *(undefined1 *)((long)(this->m_bvhAabbMin).m_floats + lVar14 * 4 + 3);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 9) =
           *(undefined1 *)((long)(this->m_bvhAabbMin).m_floats + lVar14 * 4 + 2);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 10) =
           *(undefined1 *)((long)(this->m_bvhAabbMin).m_floats + lVar14 * 4 + 1);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 0xb) =
           *(undefined1 *)((this->m_bvhAabbMin).m_floats + lVar14);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    lVar14 = 0;
    do {
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 0x18) =
           *(undefined1 *)((long)(this->m_bvhAabbMax).m_floats + lVar14 * 4 + 3);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 0x19) =
           *(undefined1 *)((long)(this->m_bvhAabbMax).m_floats + lVar14 * 4 + 2);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 0x1a) =
           *(undefined1 *)((long)(this->m_bvhAabbMax).m_floats + lVar14 * 4 + 1);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 0x1b) =
           *(undefined1 *)((this->m_bvhAabbMax).m_floats + lVar14);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    lVar14 = 0;
    do {
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 0x28) =
           *(undefined1 *)((long)(this->m_bvhQuantization).m_floats + lVar14 * 4 + 3);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 0x29) =
           *(undefined1 *)((long)(this->m_bvhQuantization).m_floats + lVar14 * 4 + 2);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 0x2a) =
           *(undefined1 *)((long)(this->m_bvhQuantization).m_floats + lVar14 * 4 + 1);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar14 * 4 + 0x2b) =
           *(undefined1 *)((this->m_bvhQuantization).m_floats + lVar14);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    uVar5 = swap_bytes(this->m_traversalMode);
    *(undefined4 *)((long)o_alignedDataBuffer + 200) = uVar5;
    iVar13 = swap_bytes(this->m_subtreeHeaderCount);
  }
  *(int *)((long)o_alignedDataBuffer + 0xf0) = iVar13;
  pvVar1 = (void *)((long)o_alignedDataBuffer + 0xf8);
  bVar8 = this->m_useQuantization;
  *(bool *)((long)o_alignedDataBuffer + 0x40) = bVar8;
  uVar9 = this->m_curNodeIndex;
  uVar24 = (ulong)uVar9;
  if (bVar8 == true) {
    if ((*(void **)((long)o_alignedDataBuffer + 0xb8) != (void *)0x0) &&
       (*(char *)((long)o_alignedDataBuffer + 0xc0) == '\x01')) {
      cbtAlignedFreeInternal(*(void **)((long)o_alignedDataBuffer + 0xb8));
    }
    *(void **)((long)o_alignedDataBuffer + 0xb8) = pvVar1;
    if (i_swapEndian) {
      if (0 < (int)uVar9) {
        pcVar10 = (this->m_quantizedContiguousNodes).m_data;
        lVar14 = 0;
        do {
          uVar4 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14));
          *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0xf8) = uVar4;
          uVar4 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14 + 2));
          *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0xfa) = uVar4;
          uVar4 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14 + 4));
          *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0xfc) = uVar4;
          uVar4 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14));
          *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0xfe) = uVar4;
          uVar4 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 2));
          *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0x100) = uVar4;
          uVar4 = swap_bytes(*(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 4));
          *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0x102) = uVar4;
          uVar5 = swap_bytes(*(undefined4 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 6));
          *(undefined4 *)((long)o_alignedDataBuffer + lVar14 + 0x104) = uVar5;
          lVar14 = lVar14 + 0x10;
        } while (uVar24 << 4 != lVar14);
      }
    }
    else if (0 < (int)uVar9) {
      pcVar10 = (this->m_quantizedContiguousNodes).m_data;
      lVar14 = 0;
      do {
        *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0xf8) =
             *(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0xfa) =
             *(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14 + 2);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0xfc) =
             *(undefined2 *)((long)pcVar10->m_quantizedAabbMin + lVar14 + 4);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0xfe) =
             *(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0x100) =
             *(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 2);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar14 + 0x102) =
             *(undefined2 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 4);
        *(undefined4 *)((long)o_alignedDataBuffer + lVar14 + 0x104) =
             *(undefined4 *)((long)pcVar10->m_quantizedAabbMax + lVar14 + 6);
        lVar14 = lVar14 + 0x10;
      } while (uVar24 << 4 != lVar14);
    }
    plVar19 = (long *)((long)o_alignedDataBuffer + 0xb8);
    puVar25 = (undefined4 *)((long)o_alignedDataBuffer + 0xac);
    pcVar22 = (char *)((long)o_alignedDataBuffer + 0xc0);
    puVar23 = (undefined4 *)((long)o_alignedDataBuffer + 0xb0);
    lVar14 = (long)(int)uVar9 << 4;
  }
  else {
    if ((*(void **)((long)o_alignedDataBuffer + 0x78) != (void *)0x0) &&
       (*(char *)((long)o_alignedDataBuffer + 0x80) == '\x01')) {
      cbtAlignedFreeInternal(*(void **)((long)o_alignedDataBuffer + 0x78));
    }
    plVar19 = (long *)((long)o_alignedDataBuffer + 0x78);
    pcVar22 = (char *)((long)o_alignedDataBuffer + 0x80);
    *(undefined1 *)((long)o_alignedDataBuffer + 0x80) = 0;
    *(void **)((long)o_alignedDataBuffer + 0x78) = pvVar1;
    *(uint *)((long)o_alignedDataBuffer + 0x6c) = uVar9;
    *(uint *)((long)o_alignedDataBuffer + 0x70) = uVar9;
    pvVar20 = pvVar1;
    if (i_swapEndian) {
      if (0 < (int)uVar9) {
        pcVar15 = (this->m_contiguousNodes).m_data;
        lVar14 = 3;
        lVar26 = 0x13;
        uVar16 = 0;
        do {
          lVar18 = 0;
          do {
            *(undefined1 *)((long)pvVar20 + lVar18 * 4 + lVar14 + -3) =
                 *(undefined1 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar18 * 4 + lVar14);
            *(undefined1 *)((long)pvVar20 + lVar18 * 4 + lVar14 + -2) =
                 *(undefined1 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar18 * 4 + lVar14 + -1);
            *(undefined1 *)((long)pvVar20 + lVar18 * 4 + lVar14 + -1) =
                 *(undefined1 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar18 * 4 + lVar14 + -2);
            *(undefined1 *)((long)pvVar20 + lVar18 * 4 + lVar14) =
                 *(undefined1 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar18 * 4 + lVar14 + -3);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          pcVar15 = (this->m_contiguousNodes).m_data;
          lVar21 = 0;
          lVar18 = *plVar19 + lVar26;
          do {
            *(undefined1 *)(lVar18 + -3 + lVar21 * 4) =
                 *(undefined1 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar21 * 4 + lVar26);
            *(undefined1 *)(lVar18 + -2 + lVar21 * 4) =
                 *(undefined1 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar21 * 4 + lVar26 + -1);
            *(undefined1 *)(lVar18 + -1 + lVar21 * 4) =
                 *(undefined1 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar21 * 4 + lVar26 + -2);
            *(undefined1 *)(lVar18 + lVar21 * 4) =
                 *(undefined1 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar21 * 4 + lVar26 + -3);
            lVar21 = lVar21 + 1;
          } while (lVar21 != 4);
          pcVar15 = (this->m_contiguousNodes).m_data;
          pvVar20 = (void *)*plVar19;
          uVar17 = uVar16 + 1;
          lVar14 = lVar14 + 0x40;
          lVar26 = lVar26 + 0x40;
          uVar6 = pcVar15[uVar16].m_escapeIndex;
          uVar7 = pcVar15[uVar16].m_subPart;
          auVar27._4_4_ = uVar7;
          auVar27._0_4_ = uVar6;
          auVar27._8_8_ = 0;
          auVar27 = vpshufb_avx(auVar27,ZEXT816(0x405060700010203));
          *(long *)((long)pvVar20 + uVar16 * 0x40 + 0x20) = auVar27._0_8_;
          uVar5 = swap_bytes(pcVar15[uVar16].m_triangleIndex);
          *(undefined4 *)((long)pvVar20 + uVar16 * 0x40 + 0x28) = uVar5;
          uVar16 = uVar17;
        } while (uVar17 != uVar24);
      }
    }
    else if (0 < (int)uVar9) {
      pcVar15 = (this->m_contiguousNodes).m_data;
      lVar14 = 0;
      do {
        puVar2 = (undefined8 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar14);
        uVar12 = puVar2[1];
        *(undefined8 *)((long)pvVar20 + lVar14) = *puVar2;
        ((undefined8 *)((long)pvVar20 + lVar14))[1] = uVar12;
        puVar2 = (undefined8 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + lVar14);
        uVar12 = puVar2[1];
        puVar3 = (undefined8 *)(*plVar19 + 0x10 + lVar14);
        *puVar3 = *puVar2;
        puVar3[1] = uVar12;
        pcVar15 = (this->m_contiguousNodes).m_data;
        pvVar20 = (void *)*plVar19;
        *(undefined8 *)((long)pvVar20 + lVar14 + 0x20) =
             *(undefined8 *)(pcVar15->m_padding + lVar14 + -0xc);
        *(undefined4 *)((long)pvVar20 + lVar14 + 0x28) =
             *(undefined4 *)(pcVar15->m_padding + lVar14 + -4);
        lVar14 = lVar14 + 0x40;
      } while (uVar24 << 6 != lVar14);
    }
    lVar14 = (long)(int)uVar9 << 6;
    puVar25 = (undefined4 *)((long)o_alignedDataBuffer + 0x6c);
    puVar23 = (undefined4 *)((long)o_alignedDataBuffer + 0x70);
    if (*pcVar22 == '\x01') {
      cbtAlignedFreeInternal(pvVar20);
    }
  }
  *pcVar22 = '\0';
  *plVar19 = 0;
  *puVar25 = 0;
  *puVar23 = 0;
  lVar26 = (long)pvVar1 + lVar14;
  if ((*(void **)((long)o_alignedDataBuffer + 0xe0) != (void *)0x0) &&
     (*(char *)((long)o_alignedDataBuffer + 0xe8) == '\x01')) {
    cbtAlignedFreeInternal(*(void **)((long)o_alignedDataBuffer + 0xe0));
  }
  *(long *)((long)o_alignedDataBuffer + 0xe0) = lVar26;
  uVar9 = this->m_subtreeHeaderCount;
  if (i_swapEndian) {
    if (0 < (int)uVar9) {
      pcVar11 = (this->m_SubtreeHeaders).m_data;
      lVar26 = 0;
      do {
        uVar4 = swap_bytes(*(undefined2 *)((long)pcVar11->m_quantizedAabbMin + lVar26));
        *(undefined2 *)((long)o_alignedDataBuffer + lVar26 + lVar14 + 0xf8) = uVar4;
        uVar4 = swap_bytes(*(undefined2 *)((long)pcVar11->m_quantizedAabbMin + lVar26 + 2));
        *(undefined2 *)((long)o_alignedDataBuffer + lVar26 + lVar14 + 0xfa) = uVar4;
        uVar4 = swap_bytes(*(undefined2 *)((long)pcVar11->m_quantizedAabbMin + lVar26 + 4));
        *(undefined2 *)((long)o_alignedDataBuffer + lVar26 + lVar14 + 0xfc) = uVar4;
        uVar4 = swap_bytes(*(undefined2 *)((long)pcVar11->m_quantizedAabbMax + lVar26));
        *(undefined2 *)((long)o_alignedDataBuffer + lVar26 + lVar14 + 0xfe) = uVar4;
        uVar4 = swap_bytes(*(undefined2 *)((long)pcVar11->m_quantizedAabbMax + lVar26 + 2));
        *(undefined2 *)((long)o_alignedDataBuffer + lVar26 + lVar14 + 0x100) = uVar4;
        uVar4 = swap_bytes(*(undefined2 *)((long)pcVar11->m_quantizedAabbMax + lVar26 + 4));
        *(undefined2 *)((long)o_alignedDataBuffer + lVar26 + lVar14 + 0x102) = uVar4;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)((long)pcVar11->m_quantizedAabbMax + lVar26 + 6);
        auVar27 = vpshufb_avx(auVar28,ZEXT816(0x405060700010203));
        *(long *)((long)o_alignedDataBuffer + lVar26 + lVar14 + 0x104) = auVar27._0_8_;
        lVar26 = lVar26 + 0x20;
      } while ((ulong)uVar9 << 5 != lVar26);
    }
  }
  else if (0 < (int)uVar9) {
    pcVar11 = (this->m_SubtreeHeaders).m_data;
    lVar14 = 0;
    lVar18 = 0;
    do {
      lVar18 = lVar18 + 1;
      *(undefined2 *)(lVar26 + lVar14) = *(undefined2 *)((long)pcVar11->m_quantizedAabbMin + lVar14)
      ;
      *(undefined2 *)(lVar26 + 2 + lVar14) =
           *(undefined2 *)((long)pcVar11->m_quantizedAabbMin + lVar14 + 2);
      *(undefined2 *)(lVar26 + 4 + lVar14) =
           *(undefined2 *)((long)pcVar11->m_quantizedAabbMin + lVar14 + 4);
      *(undefined2 *)(lVar26 + 6 + lVar14) =
           *(undefined2 *)((long)pcVar11->m_quantizedAabbMax + lVar14);
      *(undefined2 *)(lVar26 + 8 + lVar14) =
           *(undefined2 *)((long)pcVar11->m_quantizedAabbMax + lVar14 + 2);
      *(undefined2 *)(lVar26 + 10 + lVar14) =
           *(undefined2 *)((long)pcVar11->m_quantizedAabbMax + lVar14 + 4);
      *(undefined8 *)(lVar26 + 0xc + lVar14) =
           *(undefined8 *)((long)pcVar11->m_quantizedAabbMax + lVar14 + 6);
      *(undefined8 *)(lVar26 + 0x14 + lVar14) = 0;
      *(undefined4 *)(lVar26 + 0x1c + lVar14) = 0;
      lVar14 = lVar14 + 0x20;
    } while (lVar18 < this->m_subtreeHeaderCount);
  }
  *(undefined1 *)((long)o_alignedDataBuffer + 0xe8) = 0;
  *(undefined8 *)((long)o_alignedDataBuffer + 0xe0) = 0;
  *(undefined8 *)((long)o_alignedDataBuffer + 0xd4) = 0;
  *(undefined8 *)o_alignedDataBuffer = 0;
  return true;
}

Assistant:

bool cbtQuantizedBvh::serialize(void* o_alignedDataBuffer, unsigned /*i_dataBufferSize */, bool i_swapEndian) const
{
	cbtAssert(m_subtreeHeaderCount == m_SubtreeHeaders.size());
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

	/*	if (i_dataBufferSize < calculateSerializeBufferSize() || o_alignedDataBuffer == NULL || (((unsigned)o_alignedDataBuffer & BVH_ALIGNMENT_MASK) != 0))
	{
		///check alignedment for buffer?
		cbtAssert(0);
		return false;
	}
*/

	cbtQuantizedBvh* targetBvh = (cbtQuantizedBvh*)o_alignedDataBuffer;

	// construct the class so the virtual function table, etc will be set up
	// Also, m_leafNodes and m_quantizedLeafNodes will be initialized to default values by the constructor
	new (targetBvh) cbtQuantizedBvh;

	if (i_swapEndian)
	{
		targetBvh->m_curNodeIndex = static_cast<int>(cbtSwapEndian(m_curNodeIndex));

		cbtSwapVector3Endian(m_bvhAabbMin, targetBvh->m_bvhAabbMin);
		cbtSwapVector3Endian(m_bvhAabbMax, targetBvh->m_bvhAabbMax);
		cbtSwapVector3Endian(m_bvhQuantization, targetBvh->m_bvhQuantization);

		targetBvh->m_traversalMode = (cbtTraversalMode)cbtSwapEndian(m_traversalMode);
		targetBvh->m_subtreeHeaderCount = static_cast<int>(cbtSwapEndian(m_subtreeHeaderCount));
	}
	else
	{
		targetBvh->m_curNodeIndex = m_curNodeIndex;
		targetBvh->m_bvhAabbMin = m_bvhAabbMin;
		targetBvh->m_bvhAabbMax = m_bvhAabbMax;
		targetBvh->m_bvhQuantization = m_bvhQuantization;
		targetBvh->m_traversalMode = m_traversalMode;
		targetBvh->m_subtreeHeaderCount = m_subtreeHeaderCount;
	}

	targetBvh->m_useQuantization = m_useQuantization;

	unsigned char* nodeData = (unsigned char*)targetBvh;
	nodeData += sizeof(cbtQuantizedBvh);

	unsigned sizeToAdd = 0;  //(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;

	int nodeCount = m_curNodeIndex;

	if (m_useQuantization)
	{
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = static_cast<int>(cbtSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex;
			}
		}
		nodeData += sizeof(cbtQuantizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}
	else
	{
		targetBvh->m_contiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				cbtSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMinOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg);
				cbtSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMaxOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg);

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = static_cast<int>(cbtSwapEndian(m_contiguousNodes[nodeIndex].m_escapeIndex));
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = static_cast<int>(cbtSwapEndian(m_contiguousNodes[nodeIndex].m_subPart));
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = static_cast<int>(cbtSwapEndian(m_contiguousNodes[nodeIndex].m_triangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg = m_contiguousNodes[nodeIndex].m_aabbMinOrg;
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg = m_contiguousNodes[nodeIndex].m_aabbMaxOrg;

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = m_contiguousNodes[nodeIndex].m_escapeIndex;
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = m_contiguousNodes[nodeIndex].m_subPart;
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = m_contiguousNodes[nodeIndex].m_triangleIndex;
			}
		}
		nodeData += sizeof(cbtOptimizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_contiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}

	sizeToAdd = 0;  //(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;

	// Now serialize the subtree headers
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(nodeData, m_subtreeHeaderCount, m_subtreeHeaderCount);
	if (i_swapEndian)
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = cbtSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = static_cast<int>(cbtSwapEndian(m_SubtreeHeaders[i].m_rootNodeIndex));
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = static_cast<int>(cbtSwapEndian(m_SubtreeHeaders[i].m_subtreeSize));
		}
	}
	else
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = (m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = (m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = (m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = (m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = (m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = (m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = (m_SubtreeHeaders[i].m_rootNodeIndex);
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = (m_SubtreeHeaders[i].m_subtreeSize);

			// need to clear padding in destination buffer
			targetBvh->m_SubtreeHeaders[i].m_padding[0] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[1] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[2] = 0;
		}
	}
	nodeData += sizeof(cbtBvhSubtreeInfo) * m_subtreeHeaderCount;

	// this clears the pointer in the member variable it doesn't really do anything to the data
	// it does call the destructor on the contained objects, but they are all classes with no destructor defined
	// so the memory (which is not freed) is left alone
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(NULL, 0, 0);

	// this wipes the virtual function table pointer at the start of the buffer for the class
	*((void**)o_alignedDataBuffer) = NULL;

	return true;
}